

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadInitExpr(BinaryReader *this,Index index,bool require_i32)

{
  bool bVar1;
  Enum EVar2;
  Result RVar3;
  uint local_94;
  uint32_t uStack_90;
  Index global_index;
  uint32_t local_88 [2];
  Enum local_80;
  Enum local_7c;
  undefined1 local_78 [8];
  v128 value_bits_2;
  uint64_t local_60;
  uint64_t value_bits_1;
  Enum local_50;
  uint32_t local_4c;
  Enum local_48;
  uint32_t value_bits;
  uint64_t local_40;
  uint64_t value_1;
  uint32_t local_30;
  Enum local_2c;
  uint32_t value;
  Opcode local_24;
  byte local_1d;
  Opcode opcode;
  bool require_i32_local;
  Index index_local;
  BinaryReader *this_local;
  
  local_1d = require_i32;
  opcode.enum_ = index;
  value = (uint32_t)ReadOpcode(this,&local_24,"opcode");
  bVar1 = Failed((Result)value);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    bVar1 = Opcode::IsEnabled(&local_24,&this->options_->features);
    if (bVar1) {
      EVar2 = Opcode::operator_cast_to_Enum(&local_24);
      if (EVar2 == End) {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      else {
        if (EVar2 == GetGlobal) {
          RVar3 = ReadIndex(this,&local_94,"init_expr get_global index");
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                                  (this->delegate_,(ulong)opcode.enum_,(ulong)local_94);
          bVar1 = Succeeded(RVar3);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprGetGlobalExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else if (EVar2 == I32Const) {
          local_30 = 0;
          value_1._4_4_ = ReadS32Leb128(this,&local_30,"init_expr i32.const value");
          bVar1 = Failed(value_1._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          value_1._0_4_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                         (this->delegate_,(ulong)opcode.enum_,(ulong)local_30);
          bVar1 = Succeeded(value_1._0_4_);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprI32ConstExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else if (EVar2 == I64Const) {
          local_40 = 0;
          value_bits = (uint32_t)ReadS64Leb128(this,&local_40,"init_expr i64.const value");
          bVar1 = Failed((Result)value_bits);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          local_48 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])
                               (this->delegate_,(ulong)opcode.enum_,local_40);
          bVar1 = Succeeded((Result)local_48);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprI64ConstExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else if (EVar2 == F32Const) {
          local_4c = 0;
          local_50 = (Enum)ReadF32(this,&local_4c,"init_expr f32.const value");
          bVar1 = Failed((Result)local_50);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          value_bits_1._4_4_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                         (this->delegate_,(ulong)opcode.enum_,(ulong)local_4c);
          bVar1 = Succeeded(value_bits_1._4_4_);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprF32ConstExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else if (EVar2 == F64Const) {
          local_60 = 0;
          value_bits_2.v[3] = (uint32_t)ReadF64(this,&local_60,"init_expr f64.const value");
          bVar1 = Failed((Result)value_bits_2.v[3]);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          value_bits_2.v[2] =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                         (this->delegate_,(ulong)opcode.enum_,local_60);
          bVar1 = Succeeded((Result)value_bits_2.v[2]);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprF64ConstExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else {
          if (EVar2 != V128Const) {
            RVar3 = ReportUnexpectedOpcode(this,local_24,"in initializer expression");
            return (Result)RVar3.enum_;
          }
          ZeroMemory<v128>((v128 *)local_78);
          local_7c = (Enum)ReadV128(this,(v128 *)local_78,"init_expr v128.const value");
          bVar1 = Failed((Result)local_7c);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          uStack_90 = local_78._0_4_;
          global_index = local_78._4_4_;
          local_88[0] = value_bits_2.v[0];
          local_88[1] = value_bits_2.v[1];
          local_80 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                               (this->delegate_,(ulong)opcode.enum_,local_78,value_bits_2.v._0_8_);
          bVar1 = Succeeded((Result)local_80);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnInitExprV128ConstExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        if ((((local_1d & 1) == 0) ||
            (EVar2 = Opcode::operator_cast_to_Enum(&local_24), EVar2 == I32Const)) ||
           (EVar2 = Opcode::operator_cast_to_Enum(&local_24), EVar2 == GetGlobal)) {
          RVar3 = ReadOpcode(this,&local_24,"opcode");
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            EVar2 = Opcode::operator_cast_to_Enum(&local_24);
            if (EVar2 == End) {
              Result::Result((Result *)((long)&this_local + 4),Ok);
            }
            else {
              PrintError(this,"expected END opcode after initializer expression");
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
          }
        }
        else {
          PrintError(this,"expected i32 init_expr");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
    }
    else {
      local_2c = local_24.enum_;
      this_local._4_4_ = ReportUnexpectedOpcode(this,local_24,(char *)0x0);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index, bool require_i32) {
  Opcode opcode;
  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS_OPCODE_ENABLED(opcode);

  switch (opcode) {
    case Opcode::I32Const: {
      uint32_t value = 0;
      CHECK_RESULT(ReadS32Leb128(&value, "init_expr i32.const value"));
      CALLBACK(OnInitExprI32ConstExpr, index, value);
      break;
    }

    case Opcode::I64Const: {
      uint64_t value = 0;
      CHECK_RESULT(ReadS64Leb128(&value, "init_expr i64.const value"));
      CALLBACK(OnInitExprI64ConstExpr, index, value);
      break;
    }

    case Opcode::F32Const: {
      uint32_t value_bits = 0;
      CHECK_RESULT(ReadF32(&value_bits, "init_expr f32.const value"));
      CALLBACK(OnInitExprF32ConstExpr, index, value_bits);
      break;
    }

    case Opcode::F64Const: {
      uint64_t value_bits = 0;
      CHECK_RESULT(ReadF64(&value_bits, "init_expr f64.const value"));
      CALLBACK(OnInitExprF64ConstExpr, index, value_bits);
      break;
    }

    case Opcode::V128Const: {
      v128 value_bits;
      ZeroMemory(value_bits);
      CHECK_RESULT(ReadV128(&value_bits, "init_expr v128.const value"));
      CALLBACK(OnInitExprV128ConstExpr, index, value_bits);
      break;
    }

    case Opcode::GetGlobal: {
      Index global_index;
      CHECK_RESULT(ReadIndex(&global_index, "init_expr get_global index"));
      CALLBACK(OnInitExprGetGlobalExpr, index, global_index);
      break;
    }

    case Opcode::End:
      return Result::Ok;

    default:
      return ReportUnexpectedOpcode(opcode, "in initializer expression");
  }

  if (require_i32 && opcode != Opcode::I32Const &&
      opcode != Opcode::GetGlobal) {
    PrintError("expected i32 init_expr");
    return Result::Error;
  }

  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS(opcode == Opcode::End,
               "expected END opcode after initializer expression");
  return Result::Ok;
}